

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  PCache *pPVar1;
  sqlite3_pcache_page *psVar2;
  uint in_ESI;
  PgHdr *in_RDI;
  PgHdr *pXPage;
  sqlite3_pcache_page *pOther;
  PCache *pCache;
  
  pPVar1 = in_RDI->pCache;
  psVar2 = (*sqlite3Config.pcache2.xFetch)(pPVar1->pCache,in_ESI,0);
  if (psVar2 != (sqlite3_pcache_page *)0x0) {
    *(long *)((long)psVar2->pExtra + 0x38) = *(long *)((long)psVar2->pExtra + 0x38) + 1;
    pPVar1->nRefSum = pPVar1->nRefSum + 1;
    sqlite3PcacheDrop((PgHdr *)0x16eff6);
  }
  (*sqlite3Config.pcache2.xRekey)(pPVar1->pCache,in_RDI->pPage,in_RDI->pgno,in_ESI);
  in_RDI->pgno = in_ESI;
  if (((in_RDI->flags & 2) != 0) && ((in_RDI->flags & 8) != 0)) {
    pcacheManageDirtyList(in_RDI,'\x03');
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  sqlite3_pcache_page *pOther;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  pOther = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache, newPgno, 0);
  if( pOther ){
    PgHdr *pXPage = (PgHdr*)pOther->pExtra;
    assert( pXPage->nRef==0 );
    pXPage->nRef++;
    pCache->nRefSum++;
    sqlite3PcacheDrop(pXPage);
  }
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    assert( sqlite3PcachePageSanity(p) );
  }
}